

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int SaveRAM(FILE *ff,int start,int length)

{
  CDeviceSlot *pCVar1;
  size_t sVar2;
  int local_34;
  int i;
  CDeviceSlot *S;
  int local_20;
  aint save;
  int length_local;
  int start_local;
  FILE *ff_local;
  
  if (DeviceID != (char *)0x0) {
    local_20 = length;
    if (0x10000 < length + start) {
      local_20 = -1;
    }
    if (local_20 < 1) {
      local_20 = 0x10000 - start;
    }
    save = start;
    for (local_34 = 0; local_34 < Device->SlotsCount; local_34 = local_34 + 1) {
      pCVar1 = CDevice::GetSlot(Device,local_34);
      if ((pCVar1->Address <= save) && (save < pCVar1->Address + pCVar1->Size)) {
        if (local_20 < pCVar1->Size - (save - pCVar1->Address)) {
          S._4_4_ = local_20;
        }
        else {
          S._4_4_ = pCVar1->Size - (save - pCVar1->Address);
        }
        sVar2 = fwrite(pCVar1->Page->RAM + (save - pCVar1->Address),1,(long)S._4_4_,(FILE *)ff);
        if ((int)sVar2 != S._4_4_) {
          return 0;
        }
        local_20 = local_20 - S._4_4_;
        save = S._4_4_ + save;
        if (local_20 < 1) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int SaveRAM(FILE* ff, int start, int length) {
	//unsigned int addadr = 0,save = 0;
	aint save = 0;
	if (!DeviceID) return 0;		// unreachable currently
	if (length + start > 0x10000) {
		length = -1;
	}
	if (length <= 0) {
		length = 0x10000 - start;
	}

	CDeviceSlot* S;
	for (int i=0;i<Device->SlotsCount;i++) {
		S = Device->GetSlot(i);
		if (start >= (int)S->Address  && start < (int)(S->Address + S->Size)) {
			if (length < (int)(S->Size - (start - S->Address))) {
				save = length;
			} else {
				save = S->Size - (start - S->Address);
			}
			if ((aint) fwrite(S->Page->RAM + (start - S->Address), 1, save, ff) != save) {
				return 0;
			}
			length -= save;
			start += save;
			if (length <= 0) {
				return 1;
			}
		}
	}
	return 0;		// unreachable (with current devices)
}